

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O2

Program __thiscall
soul::Compiler::build(Compiler *this,CompileMessageList *messageList,BuildBundle *bundle)

{
  pointer pSVar1;
  bool bVar2;
  CodeLocation *pCVar3;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  const_iterator __begin2;
  pointer pSVar4;
  SourceFile *file;
  Program PVar5;
  CompileMessageHandler handler;
  Compiler c;
  ArrayWithPreallocation<soul::CodeLocation,_4UL> heartFiles;
  CodeLocation local_1e0;
  CodeLocation local_1d0;
  CodeLocation local_1c0;
  CompileMessageHandler local_1b0;
  undefined1 local_188 [8];
  UTF8Reader UStack_180;
  pointer local_178;
  Pool *local_170;
  pointer local_168;
  _Alloc_hider local_160;
  pointer local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  pointer local_140;
  pointer pSStack_138;
  pointer local_130;
  pool_ptr<soul::AST::Namespace> pStack_128;
  pointer local_120;
  pointer puStack_118;
  StringDictionary local_110;
  pointer local_108;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined8 uStack_f7;
  Content local_e8;
  Allocator *local_d8;
  uint8_t *puStack_d0;
  StringDictionary *local_c8;
  undefined1 local_c0 [88];
  CompileMessage local_68;
  
  sanityCheckBuildSettings(&bundle->settings,(uint32_t)messageList,(uint32_t)bundle);
  local_c0._0_8_ = local_c0 + 0x18;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 4;
  pSVar1 = (bundle->sourceFiles).
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar4 = (bundle->sourceFiles).
                super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    CodeLocation::createFromSourceFile((CodeLocation *)local_188,pSVar4);
    UTF8Reader::findEndOfWhitespace((UTF8Reader *)&local_1b0);
    bVar2 = UTF8Reader::startsWith((UTF8Reader *)&local_1b0,"#SOUL");
    if (bVar2) {
      ArrayWithPreallocation<soul::CodeLocation,_4UL>::push_back
                ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0,
                 (CodeLocation *)local_188);
    }
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_188);
  }
  if (local_c0._8_8_ == 0) {
    Compiler((Compiler *)local_188,
             (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pSVar4 = (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (bundle->settings).overrideStandardLibrary.
             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar4 == pSVar1) {
LAB_001e6b92:
      pSVar4 = (bundle->sourceFiles).
               super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (bundle->sourceFiles).
               super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pSVar4 == pSVar1) {
          link(this,local_188,(char *)messageList);
          goto LAB_001e6c06;
        }
        CodeLocation::createFromSourceFile(&local_1d0,pSVar4);
        bVar2 = addCode((Compiler *)local_188,messageList,&local_1d0);
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_1d0.sourceCode);
        pSVar4 = pSVar4 + 1;
      } while (bVar2);
      Program::Program((Program *)this);
    }
    else {
      do {
        if (pSVar4 == pSVar1) goto LAB_001e6b92;
        CodeLocation::createFromSourceFile(&local_1c0,pSVar4);
        bVar2 = addCode((Compiler *)local_188,messageList,&local_1c0);
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_1c0.sourceCode);
        pSVar4 = pSVar4 + 1;
      } while (bVar2);
      Program::Program((Program *)this);
    }
LAB_001e6c06:
    AST::Allocator::~Allocator((Allocator *)local_188);
  }
  else {
    if ((local_c0._8_8_ != 1) ||
       (0x40 < (ulong)((long)(bundle->sourceFiles).
                             super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(bundle->sourceFiles).
                            super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>.
                            _M_impl.super__Vector_impl_data._M_start))) {
      local_188 = (undefined1  [8])0x0;
      UStack_180.data = (char *)0x0;
      Errors::onlyOneHeartFileAllowed<>();
      CodeLocation::throwError((CodeLocation *)local_188,&local_68);
    }
    pCVar3 = ArrayWithPreallocation<soul::CodeLocation,_4UL>::front
                       ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0);
    local_1e0.sourceCode.object = (pCVar3->sourceCode).object;
    if (local_1e0.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_1e0.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_1e0.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_1e0.location.data = (pCVar3->location).data;
    CompileMessageHandler::CompileMessageHandler(&local_1b0,messageList);
    heart::Parser::parse((Parser *)this,&local_1e0);
    local_160._M_p = (pointer)&local_150;
    local_188 = (undefined1  [8])0x0;
    UStack_180.data = (char *)((ulong)UStack_180.data._4_4_ << 0x20);
    local_178 = (pointer)0x1400000;
    local_170 = (Pool *)0x1400000;
    local_168 = (pointer)0xffffffff;
    local_158 = (pointer)0x0;
    local_150._M_local_buf[0] = '\0';
    local_c8 = &local_110;
    local_140 = (pointer)0x0;
    pSStack_138 = (pointer)0x0;
    local_130 = (pointer)0x0;
    pStack_128.object = (Namespace *)0x0;
    local_120 = (pointer)0x0;
    puStack_118 = (pointer)0x0;
    local_110._vptr_StringDictionary = (_func_int **)&PTR__SimpleStringDictionary_002f65c0;
    local_e8.object = (Object *)0x0;
    local_d8 = (Allocator *)0x0;
    puStack_d0 = (uint8_t *)0x0;
    local_108 = (pointer)0x0;
    uStack_100 = 0;
    uStack_ff = 0;
    uStack_f8 = 0;
    uStack_f7 = 0;
    heart::Checker::sanityCheck((Program *)this,(BuildSettings *)local_188);
    BuildSettings::~BuildSettings((BuildSettings *)local_188);
    CompileMessageHandler::~CompileMessageHandler(&local_1b0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_1e0.sourceCode);
  }
  ArrayWithPreallocation<soul::CodeLocation,_4UL>::clear
            ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0);
  PVar5.refHolder.object = extraout_RDX.object;
  PVar5.pimpl = (ProgramImpl *)this;
  return PVar5;
}

Assistant:

Program Compiler::build (CompileMessageList& messageList, const BuildBundle& bundle)
{
    sanityCheckBuildSettings (bundle.settings);

    auto heartFiles = getHEARTFiles (bundle);

    if (! heartFiles.empty())
    {
        if (heartFiles.size() > 1 || heartFiles.size() < bundle.sourceFiles.size())
            CodeLocation().throwError (Errors::onlyOneHeartFileAllowed());

        return buildHEART (messageList, heartFiles.front());
    }

    Compiler c (bundle.settings.overrideStandardLibrary.empty());

    if (! bundle.settings.overrideStandardLibrary.empty())
        for (auto& file : bundle.settings.overrideStandardLibrary)
            if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
                return {};

    for (auto& file : bundle.sourceFiles)
        if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
            return {};

    return c.link (messageList, bundle.settings);
}